

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O2

ulong __thiscall
CVmConstMapper::alloc_pool_space(CVmConstMapper *this,vm_obj_id_t obj_id,size_t len)

{
  ulong **ppuVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  
  if (this->page_size_ < len) {
    uVar3 = 0;
  }
  else {
    ppuVar1 = this->obj_addr_;
    uVar4 = obj_id >> 10;
    if (ppuVar1[uVar4] == (ulong *)0x0) {
      pvVar2 = malloc(0x2000);
      *(void **)((long)ppuVar1 + (ulong)(uVar4 * 8)) = pvVar2;
      pvVar2 = *(void **)((long)this->obj_addr_ + (ulong)(uVar4 * 8));
      if (pvVar2 == (void *)0x0) {
        err_throw(0xca);
      }
      memset(pvVar2,0,0x2000);
    }
    uVar3 = this->next_free_;
    if (this->rem_ < len) {
      uVar3 = uVar3 + this->rem_;
      this->next_free_ = uVar3;
      this->rem_ = this->page_size_;
    }
    this->obj_addr_[uVar4][obj_id & 0x3ff] = uVar3;
    this->next_free_ = this->next_free_ + len;
    this->rem_ = this->rem_ - len;
  }
  return uVar3;
}

Assistant:

ulong CVmConstMapper::alloc_pool_space(vm_obj_id_t obj_id, size_t len)
{
    ulong ret;
    
    /* 
     *   if the data block is too large to fit on a constant pool page, we
     *   can't store it 
     */
    if (len > page_size_)
        return 0;
    
    /* if the translation page isn't mapped yet, map it */
    if (obj_addr_[obj_id / 1024] == 0)
    {
        /* allocate a new page */
        obj_addr_[obj_id / 1024] =
            (ulong *)t3malloc(1024 * sizeof(obj_addr_[0][0]));

        /* if that failed, throw an error */
        if (obj_addr_[obj_id / 1024] == 0)
            err_throw(VMERR_OUT_OF_MEMORY);

        /* clear the new page */
        memset(obj_addr_[obj_id / 1024], 0, 1024 * sizeof(obj_addr_[0][0]));
    }

    /* if the block doesn't fit on this page, skip to the next page */
    if (len > rem_)
    {
        /* skip past the remainder of this page */
        next_free_ += rem_;

        /* we have the whole next page available now */
        rem_ = page_size_;
    }

    /* remember the object ID's address in the translation list */
    ret = obj_addr_[obj_id / 1024][obj_id % 1024] = next_free_;

    /* skip past the data */
    next_free_ += len;
    rem_ -= len;

    /* return the new address */
    return ret;
}